

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_0::deviceMemoryProperties
          (TestStatus *__return_storage_ptr__,Context *context)

{
  bool bVar1;
  TestContext *this;
  TestLog *this_00;
  InstanceInterface *pIVar2;
  VkPhysicalDevice pVVar3;
  MessageBuilder *pMVar4;
  TestLog *this_01;
  allocator<char> local_1359;
  string local_1358;
  allocator<char> local_1331;
  string local_1330;
  Bitfield<32UL> local_1310;
  MessageBuilder local_12f8;
  bool local_1171;
  bool *local_1170;
  bool *requiredFlagsFoundIterator;
  string local_1160;
  MessageBuilder local_1140;
  allocator<char> local_fb9;
  string local_fb8;
  MessageBuilder local_f98;
  allocator<char> local_e11;
  string local_e10;
  MessageBuilder local_df0;
  uint local_c6c;
  VkMemoryPropertyFlags *local_c68;
  uint *local_c60;
  uint *local_c58;
  VkMemoryPropertyFlags *requiredFlagsIterator;
  VkMemoryPropertyFlags bitsToCheck;
  MessageBuilder local_c28;
  byte local_aa5;
  uint local_aa4;
  bool local_a9e;
  bool validPropTypeFound;
  deUint32 memoryNdx;
  bool requiredFlagsFound [1];
  VkMemoryPropertyFlags requiredPropertyFlags [1];
  VkMemoryPropertyFlags validPropertyFlags [9];
  MessageBuilder local_a50;
  allocator<char> local_8c9;
  string local_8c8;
  uint local_8a4;
  MessageBuilder local_8a0;
  allocator<char> local_719;
  string local_718;
  MessageBuilder local_6f8;
  int local_574;
  VkPhysicalDevice pVStack_570;
  deInt32 ndx;
  MessageBuilder local_558;
  MessageBuilder local_3d8;
  undefined1 local_258 [8];
  deUint8 buffer [552];
  VkPhysicalDeviceMemoryProperties *memProps;
  TestLog *log;
  Context *context_local;
  
  this = Context::getTestContext(context);
  this_00 = tcu::TestContext::getLog(this);
  ::deMemset((VkPhysicalDeviceMemoryProperties *)local_258,0xcd,0x228);
  pIVar2 = Context::getInstanceInterface(context);
  pVVar3 = Context::getPhysicalDevice(context);
  (*pIVar2->_vptr_InstanceInterface[7])(pIVar2,pVVar3,(VkPhysicalDeviceMemoryProperties *)local_258)
  ;
  tcu::TestLog::operator<<(&local_558,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_558,(char (*) [10])"device = ");
  pVStack_570 = Context::getPhysicalDevice(context);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&stack0xfffffffffffffa90);
  this_01 = tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::TestLog::operator<<(&local_3d8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_3d8,(VkPhysicalDeviceMemoryProperties *)local_258)
  ;
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_3d8);
  tcu::MessageBuilder::~MessageBuilder(&local_558);
  for (local_574 = 0; local_574 < 0x20; local_574 = local_574 + 1) {
    if (buffer[(long)local_574 + 0x200] != 0xcd) {
      tcu::TestLog::operator<<(&local_6f8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_6f8,(char (*) [39])"deviceMemoryProperties - Guard offset ");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_574);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [11])0x12bd17a);
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_6f8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_718,"deviceMemoryProperties buffer overflow",&local_719);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_718);
      std::__cxx11::string::~string((string *)&local_718);
      std::allocator<char>::~allocator(&local_719);
      return __return_storage_ptr__;
    }
  }
  if ((uint)buffer._252_4_ < 0x10) {
    if ((buffer._252_4_ == 1) && ((buffer._264_4_ & 1) == 0)) {
      tcu::TestLog::operator<<(&local_a50,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_a50,
                          (char (*) [64])
                          "deviceMemoryProperties - Single heap is not marked DEVICE_LOCAL");
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_a50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(validPropertyFlags + 8),"deviceMemoryProperties invalid HeapFlags",
                 (allocator<char> *)((long)validPropertyFlags + 0x1f));
      tcu::TestStatus::fail(__return_storage_ptr__,(string *)(validPropertyFlags + 8));
      std::__cxx11::string::~string((string *)(validPropertyFlags + 8));
      std::allocator<char>::~allocator((allocator<char> *)((long)validPropertyFlags + 0x1f));
    }
    else {
      memcpy(&stack0xfffffffffffff568,&DAT_012c7de0,0x24);
      memoryNdx = 6;
      local_a9e = false;
      std::fill<bool*,bool>(&validPropTypeFound,(bool *)&memoryNdx,&local_a9e);
      for (local_aa4 = 0; local_aa4 < (uint)local_258._0_4_; local_aa4 = local_aa4 + 1) {
        local_aa5 = 0;
        if ((uint)buffer._252_4_ <= *(uint *)(buffer + (ulong)local_aa4 * 8)) {
          tcu::TestLog::operator<<(&local_c28,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar4 = tcu::MessageBuilder::operator<<
                             (&local_c28,(char (*) [36])"deviceMemoryProperties - heapIndex ");
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(uint *)(buffer + (ulong)local_aa4 * 8));
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [23])" larger than heapCount");
          tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_c28);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&bitsToCheck,"deviceMemoryProperties - invalid heapIndex",
                     (allocator<char> *)((long)&requiredFlagsIterator + 7));
          tcu::TestStatus::fail(__return_storage_ptr__,(string *)&bitsToCheck);
          std::__cxx11::string::~string((string *)&bitsToCheck);
          std::allocator<char>::~allocator((allocator<char> *)((long)&requiredFlagsIterator + 7));
          return __return_storage_ptr__;
        }
        requiredFlagsIterator._0_4_ = 0x1f;
        for (local_c58 = &memoryNdx; local_c58 != (uint *)&stack0xfffffffffffff568;
            local_c58 = local_c58 + 1) {
          if ((*(uint *)(local_258 + (ulong)local_aa4 * 8 + 4) & *local_c58) == *local_c58) {
            (&validPropTypeFound)[(long)local_c58 - (long)&memoryNdx >> 2] = true;
          }
        }
        local_c60 = (uint *)&stack0xfffffffffffff568;
        local_c68 = validPropertyFlags + 7;
        local_c6c = *(uint *)(local_258 + (ulong)local_aa4 * 8 + 4) & 0x1f;
        bVar1 = de::contains<unsigned_int_const*,unsigned_int>(&local_c60,&local_c68,&local_c6c);
        if (bVar1) {
          local_aa5 = 1;
        }
        if ((local_aa5 & 1) == 0) {
          tcu::TestLog::operator<<(&local_df0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar4 = tcu::MessageBuilder::operator<<
                             (&local_df0,(char (*) [40])"deviceMemoryProperties - propertyFlags ");
          pMVar4 = tcu::MessageBuilder::operator<<
                             (pMVar4,(uint *)(local_258 + (ulong)local_aa4 * 8 + 4));
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [11])0x12bd17a);
          tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_df0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e10,"deviceMemoryProperties propertyFlags not valid",
                     &local_e11);
          tcu::TestStatus::fail(__return_storage_ptr__,&local_e10);
          std::__cxx11::string::~string((string *)&local_e10);
          std::allocator<char>::~allocator(&local_e11);
          return __return_storage_ptr__;
        }
        if ((*(uint *)(local_258 + (ulong)local_aa4 * 8 + 4) & 1) == 0) {
          if ((*(uint *)(buffer + (ulong)*(uint *)(buffer + (ulong)local_aa4 * 8) * 0x10 + 0x108) &
              1) != 0) {
            tcu::TestLog::operator<<
                      (&local_1140,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar4 = tcu::MessageBuilder::operator<<
                               (&local_1140,
                                (char (*) [91])
                                "deviceMemoryProperties - non-DEVICE_LOCAL memory type references heap with is DEVICE_LOCAL"
                               );
            tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_1140);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1160,
                       "deviceMemoryProperties inconsistent memoryType and HeapFlags",
                       (allocator<char> *)((long)&requiredFlagsFoundIterator + 7));
            tcu::TestStatus::fail(__return_storage_ptr__,&local_1160);
            std::__cxx11::string::~string((string *)&local_1160);
            std::allocator<char>::~allocator
                      ((allocator<char> *)((long)&requiredFlagsFoundIterator + 7));
            return __return_storage_ptr__;
          }
        }
        else if ((*(uint *)(buffer + (ulong)*(uint *)(buffer + (ulong)local_aa4 * 8) * 0x10 + 0x108)
                 & 1) == 0) {
          tcu::TestLog::operator<<(&local_f98,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar4 = tcu::MessageBuilder::operator<<
                             (&local_f98,
                              (char (*) [92])
                              "deviceMemoryProperties - DEVICE_LOCAL memory type references heap which is not DEVICE_LOCAL"
                             );
          tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_f98);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_fb8,
                     "deviceMemoryProperties inconsistent memoryType and HeapFlags",&local_fb9);
          tcu::TestStatus::fail(__return_storage_ptr__,&local_fb8);
          std::__cxx11::string::~string((string *)&local_fb8);
          std::allocator<char>::~allocator(&local_fb9);
          return __return_storage_ptr__;
        }
      }
      local_1171 = false;
      local_1170 = std::find<bool*,bool>(&validPropTypeFound,(bool *)&memoryNdx,&local_1171);
      if (local_1170 == (bool *)&memoryNdx) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1358,"Querying memory properties succeeded",&local_1359);
        tcu::TestStatus::pass(__return_storage_ptr__,&local_1358);
        std::__cxx11::string::~string((string *)&local_1358);
        std::allocator<char>::~allocator(&local_1359);
      }
      else {
        tcu::TestLog::operator<<(&local_12f8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar4 = tcu::MessageBuilder::operator<<
                           (&local_12f8,
                            (char (*) [50])"deviceMemoryProperties - required property flags ");
        ::vk::getMemoryPropertyFlagsStr
                  (&local_1310,
                   *(VkMemoryPropertyFlags *)
                    ((long)&stack0x00000000 * -3 + (long)local_1170 * 4 + 0x1fd8));
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_1310);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [11])0x12c32db);
        tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_12f8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1330,"deviceMemoryProperties propertyFlags not valid",
                   &local_1331);
        tcu::TestStatus::fail(__return_storage_ptr__,&local_1330);
        std::__cxx11::string::~string((string *)&local_1330);
        std::allocator<char>::~allocator(&local_1331);
      }
    }
  }
  else {
    tcu::TestLog::operator<<(&local_8a0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_8a0,(char (*) [48])"deviceMemoryProperties - HeapCount larger than ")
    ;
    local_8a4 = 0x10;
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_8a4);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_8a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8c8,"deviceMemoryProperties HeapCount too large",&local_8c9);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_8c8);
    std::__cxx11::string::~string((string *)&local_8c8);
    std::allocator<char>::~allocator(&local_8c9);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus deviceMemoryProperties (Context& context)
{
	TestLog&							log			= context.getTestContext().getLog();
	VkPhysicalDeviceMemoryProperties*	memProps;
	deUint8								buffer[sizeof(VkPhysicalDeviceMemoryProperties) + GUARD_SIZE];

	memProps = reinterpret_cast<VkPhysicalDeviceMemoryProperties*>(buffer);
	deMemset(buffer, GUARD_VALUE, sizeof(buffer));

	context.getInstanceInterface().getPhysicalDeviceMemoryProperties(context.getPhysicalDevice(), memProps);

	log << TestLog::Message << "device = " << context.getPhysicalDevice() << TestLog::EndMessage
		<< TestLog::Message << *memProps << TestLog::EndMessage;

	for (deInt32 ndx = 0; ndx < GUARD_SIZE; ndx++)
	{
		if (buffer[ndx + sizeof(VkPhysicalDeviceMemoryProperties)] != GUARD_VALUE)
		{
			log << TestLog::Message << "deviceMemoryProperties - Guard offset " << ndx << " not valid" << TestLog::EndMessage;
			return tcu::TestStatus::fail("deviceMemoryProperties buffer overflow");
		}
	}

	if (memProps->memoryHeapCount >= VK_MAX_MEMORY_HEAPS)
	{
		log << TestLog::Message << "deviceMemoryProperties - HeapCount larger than " << (deUint32)VK_MAX_MEMORY_HEAPS << TestLog::EndMessage;
		return tcu::TestStatus::fail("deviceMemoryProperties HeapCount too large");
	}

	if (memProps->memoryHeapCount == 1)
	{
		if ((memProps->memoryHeaps[0].flags & VK_MEMORY_HEAP_DEVICE_LOCAL_BIT) == 0)
		{
			log << TestLog::Message << "deviceMemoryProperties - Single heap is not marked DEVICE_LOCAL" << TestLog::EndMessage;
			return tcu::TestStatus::fail("deviceMemoryProperties invalid HeapFlags");
		}
	}

	const VkMemoryPropertyFlags validPropertyFlags[] =
	{
		0,
		VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT,
		VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT|VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT|VK_MEMORY_PROPERTY_HOST_COHERENT_BIT,
		VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT|VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT|VK_MEMORY_PROPERTY_HOST_CACHED_BIT,
		VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT|VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT|VK_MEMORY_PROPERTY_HOST_CACHED_BIT|VK_MEMORY_PROPERTY_HOST_COHERENT_BIT,
		VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT|VK_MEMORY_PROPERTY_HOST_COHERENT_BIT,
		VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT|VK_MEMORY_PROPERTY_HOST_CACHED_BIT,
		VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT|VK_MEMORY_PROPERTY_HOST_CACHED_BIT|VK_MEMORY_PROPERTY_HOST_COHERENT_BIT,
		VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT|VK_MEMORY_PROPERTY_LAZILY_ALLOCATED_BIT
	};

	const VkMemoryPropertyFlags requiredPropertyFlags[] =
	{
		VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT|VK_MEMORY_PROPERTY_HOST_COHERENT_BIT
	};

	bool requiredFlagsFound[DE_LENGTH_OF_ARRAY(requiredPropertyFlags)];
	std::fill(DE_ARRAY_BEGIN(requiredFlagsFound), DE_ARRAY_END(requiredFlagsFound), false);

	for (deUint32 memoryNdx = 0; memoryNdx < memProps->memoryTypeCount; memoryNdx++)
	{
		bool validPropTypeFound = false;

		if (memProps->memoryTypes[memoryNdx].heapIndex >= memProps->memoryHeapCount)
		{
			log << TestLog::Message << "deviceMemoryProperties - heapIndex " << memProps->memoryTypes[memoryNdx].heapIndex << " larger than heapCount" << TestLog::EndMessage;
			return tcu::TestStatus::fail("deviceMemoryProperties - invalid heapIndex");
		}

		const VkMemoryPropertyFlags bitsToCheck = VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT|VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT|VK_MEMORY_PROPERTY_HOST_COHERENT_BIT|VK_MEMORY_PROPERTY_HOST_CACHED_BIT|VK_MEMORY_PROPERTY_LAZILY_ALLOCATED_BIT;

		for (const VkMemoryPropertyFlags* requiredFlagsIterator = DE_ARRAY_BEGIN(requiredPropertyFlags); requiredFlagsIterator != DE_ARRAY_END(requiredPropertyFlags); requiredFlagsIterator++)
			if ((memProps->memoryTypes[memoryNdx].propertyFlags & *requiredFlagsIterator) == *requiredFlagsIterator)
				requiredFlagsFound[requiredFlagsIterator - DE_ARRAY_BEGIN(requiredPropertyFlags)] = true;

		if (de::contains(DE_ARRAY_BEGIN(validPropertyFlags), DE_ARRAY_END(validPropertyFlags), memProps->memoryTypes[memoryNdx].propertyFlags & bitsToCheck))
			validPropTypeFound = true;

		if (!validPropTypeFound)
		{
			log << TestLog::Message << "deviceMemoryProperties - propertyFlags "
				<< memProps->memoryTypes[memoryNdx].propertyFlags << " not valid" << TestLog::EndMessage;
			return tcu::TestStatus::fail("deviceMemoryProperties propertyFlags not valid");
		}

		if (memProps->memoryTypes[memoryNdx].propertyFlags & VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT)
		{
			if ((memProps->memoryHeaps[memProps->memoryTypes[memoryNdx].heapIndex].flags & VK_MEMORY_HEAP_DEVICE_LOCAL_BIT) == 0)
			{
				log << TestLog::Message << "deviceMemoryProperties - DEVICE_LOCAL memory type references heap which is not DEVICE_LOCAL" << TestLog::EndMessage;
				return tcu::TestStatus::fail("deviceMemoryProperties inconsistent memoryType and HeapFlags");
			}
		}
		else
		{
			if (memProps->memoryHeaps[memProps->memoryTypes[memoryNdx].heapIndex].flags & VK_MEMORY_HEAP_DEVICE_LOCAL_BIT)
			{
				log << TestLog::Message << "deviceMemoryProperties - non-DEVICE_LOCAL memory type references heap with is DEVICE_LOCAL" << TestLog::EndMessage;
				return tcu::TestStatus::fail("deviceMemoryProperties inconsistent memoryType and HeapFlags");
			}
		}
	}

	bool* requiredFlagsFoundIterator = std::find(DE_ARRAY_BEGIN(requiredFlagsFound), DE_ARRAY_END(requiredFlagsFound), false);
	if (requiredFlagsFoundIterator != DE_ARRAY_END(requiredFlagsFound))
	{
		DE_ASSERT(requiredFlagsFoundIterator - DE_ARRAY_BEGIN(requiredFlagsFound) <= DE_LENGTH_OF_ARRAY(requiredPropertyFlags));
		log << TestLog::Message << "deviceMemoryProperties - required property flags "
			<< getMemoryPropertyFlagsStr(requiredPropertyFlags[requiredFlagsFoundIterator - DE_ARRAY_BEGIN(requiredFlagsFound)]) << " not found" << TestLog::EndMessage;

		return tcu::TestStatus::fail("deviceMemoryProperties propertyFlags not valid");
	}

	return tcu::TestStatus::pass("Querying memory properties succeeded");
}